

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O0

void trt_pose::parse::munkresStep5
               (float *cost_graph,int M,CoverTable *cover_table,int nrows,int ncols)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int local_48;
  int local_44;
  int i_2;
  int j_2;
  int j_1;
  int i_1;
  int j;
  int i;
  float min;
  bool valid;
  int ncols_local;
  int nrows_local;
  CoverTable *cover_table_local;
  int M_local;
  float *cost_graph_local;
  
  bVar2 = false;
  for (i_1 = 0; i_1 < nrows; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < ncols; j_1 = j_1 + 1) {
      bVar1 = utils::CoverTable::isCovered(cover_table,i_1,j_1);
      if (!bVar1) {
        if (bVar2) {
          if (cost_graph[i_1 * M + j_1] < (float)j) {
            j = (int)cost_graph[i_1 * M + j_1];
          }
        }
        else {
          j = (int)cost_graph[i_1 * M + j_1];
          bVar2 = true;
        }
      }
    }
  }
  for (j_2 = 0; j_2 < nrows; j_2 = j_2 + 1) {
    bVar2 = utils::CoverTable::isRowCovered(cover_table,j_2);
    if (bVar2) {
      for (i_2 = 0; i_2 < ncols; i_2 = i_2 + 1) {
        iVar3 = j_2 * M + i_2;
        cost_graph[iVar3] = (float)j + cost_graph[iVar3];
      }
    }
  }
  for (local_44 = 0; local_44 < ncols; local_44 = local_44 + 1) {
    bVar2 = utils::CoverTable::isColCovered(cover_table,local_44);
    if (!bVar2) {
      for (local_48 = 0; local_48 < nrows; local_48 = local_48 + 1) {
        iVar3 = local_48 * M + local_44;
        cost_graph[iVar3] = cost_graph[iVar3] - (float)j;
      }
    }
  }
  return;
}

Assistant:

void munkresStep5(float *cost_graph, const int M, const CoverTable &cover_table,
                  const int nrows, const int ncols) {
  bool valid = false;
  float min;
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (!cover_table.isCovered(i, j)) {
        if (!valid) {
          min = cost_graph[i * M + j];
          valid = true;
        } else if (cost_graph[i * M + j] < min) {
          min = cost_graph[i * M + j];
        }
      }
    }
  }

  for (int i = 0; i < nrows; i++) {
    if (cover_table.isRowCovered(i)) {
      for (int j = 0; j < ncols; j++) {
        cost_graph[i * M + j] += min;
      }
      //       cost_graph.addToRow(i, min);
    }
  }
  for (int j = 0; j < ncols; j++) {
    if (!cover_table.isColCovered(j)) {
      for (int i = 0; i < nrows; i++) {
        cost_graph[i * M + j] -= min;
      }
      //       cost_graph.addToCol(j, -min);
    }
  }
}